

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O3

void __thiscall
http_request_parsing_smoke01_Test::~http_request_parsing_smoke01_Test
          (http_request_parsing_smoke01_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

GTEST_TEST(http_request_parsing, smoke01)
{
    sub_string str = sub_string::literal(
        "GET /Protocols/rfc2616/rfc2616-sec6.html HTTP/1.1" "\r\n"
        "Host: www.w3.org" "\r\n"
        "Connection: keep-alive" "\r\n"
        "Cache-Control: max-age=0" "\r\n"
        "Accept: text/html,application/xhtml+xml,application/xml;q=0.9,image/webp,*/*;q=0.8" "\r\n"
        "Upgrade-Insecure-Requests: 1" "\r\n"
        "User-Agent: Mozilla/5.0 (Windows NT 6.3; WOW64) AppleWebKit/537.36 (KHTML, like Gecko) Chrome/47.0.2526.106 Safari/537.36" "\r\n"
        "Referer: http://www.w3.org/Protocols/rfc2616/rfc2616.html" "\r\n"
        "Accept-Encoding: gzip, deflate, sdch" "\r\n"
        "Accept-Language: en-US,en;q=0.8,ru;q=0.6" "\r\n"
        "If-None-Match: \"277f-3e3073913b100\"" "\r\n"
        "If-Modified-Since: Wed, 01 Sep 2004 13:24:52 GMT" "\r\n"
        "\r\n");
    http_request request = parse_request(str);
    EXPECT_TRUE(str.empty());
    EXPECT_EQ(request.headers["Host"][0], "www.w3.org");
}